

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O3

void __thiscall
chrono::ChSystemDescriptor::ConstraintsProject
          (ChSystemDescriptor *this,ChVectorDynamic<> *multipliers)

{
  ChConstraint *pCVar1;
  long lVar2;
  long lVar3;
  
  (*this->_vptr_ChSystemDescriptor[0x13])();
  lVar3 = (long)(this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar2 = 0;
    do {
      pCVar1 = (this->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar2];
      if (pCVar1->active == true) {
        (*pCVar1->_vptr_ChConstraint[0xb])();
      }
      lVar2 = lVar2 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar2);
  }
  (*this->_vptr_ChSystemDescriptor[0x12])(this,multipliers,0);
  return;
}

Assistant:

void ChSystemDescriptor::ConstraintsProject(ChVectorDynamic<>& multipliers) {
    FromVectorToConstraints(multipliers);

    auto vc_size = vconstraints.size();

    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive())
            vconstraints[ic]->Project();
    }

    FromConstraintsToVector(multipliers, false);
}